

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::focusInEvent(QComboBox *this,QFocusEvent *e)

{
  long lVar1;
  long *plVar2;
  QCompleter *pQVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QWidget::update(&this->super_QWidget);
  plVar2 = *(long **)(lVar1 + 0x2a0);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x28))(plVar2,e);
    pQVar3 = QLineEdit::completer(*(QLineEdit **)(lVar1 + 0x2a0));
    if (pQVar3 != (QCompleter *)0x0) {
      pQVar3 = QLineEdit::completer(*(QLineEdit **)(lVar1 + 0x2a0));
      QCompleter::setWidget(pQVar3,&this->super_QWidget);
      return;
    }
  }
  return;
}

Assistant:

void QComboBox::focusInEvent(QFocusEvent *e)
{
    Q_D(QComboBox);
    update();
    if (d->lineEdit) {
        d->lineEdit->event(e);
#if QT_CONFIG(completer)
        if (d->lineEdit->completer())
            d->lineEdit->completer()->setWidget(this);
#endif
    }
}